

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

int xmlPatternStreamable(xmlPatternPtr comp)

{
  int iVar1;
  
  if (comp == (xmlPatternPtr)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
    for (; comp != (xmlPatternPtr)0x0; comp = comp->next) {
      if (comp->stream == (xmlStreamCompPtr)0x0) {
        return 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int
xmlPatternStreamable(xmlPatternPtr comp) {
    if (comp == NULL)
        return(-1);
    while (comp != NULL) {
        if (comp->stream == NULL)
	    return(0);
	comp = comp->next;
    }
    return(1);
}